

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

IntervalMap<unsigned_long,_std::monostate,_0U> * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::operator=
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,
          IntervalMap<unsigned_long,_std::monostate,_0U> *other)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = other->height;
  this->height = uVar1;
  uVar2 = other->rootSize;
  other->rootSize = 0;
  this->rootSize = uVar2;
  memcpy(this,other,0xc0);
  if (uVar1 != 0) {
    memset(other,0,0xc4);
  }
  return this;
}

Assistant:

IntervalMap& operator=(IntervalMap&& other) noexcept {
        if (isFlat())
            rootLeaf.~RootLeaf();
        else
            rootBranch.~RootBranch();

        height = other.height;
        rootSize = std::exchange(other.rootSize, 0);

        if (other.isFlat()) {
            rootLeaf = std::move(other.rootLeaf);
        }
        else {
            rootBranch = std::move(other.rootBranch);
            other.rootBranch.~RootBranch();
            other.height = 0;
            new (&other.rootLeaf) RootLeaf();
        }

        return *this;
    }